

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

int c2mir_compile(MIR_context_t ctx,c2mir_options *ops,_func_int_void_ptr *getc_func,void *getc_data
                 ,char *source_name,FILE *output_file)

{
  ulong uVar1;
  ushort uVar2;
  short sVar3;
  pre_ctx *ppVar4;
  FILE *pFVar5;
  node_t pnVar6;
  MIR_context_t pMVar7;
  void *__ptr;
  int iVar8;
  int iVar9;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  htab_size_t hVar10;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  int extraout_EAX_08;
  int extraout_EAX_09;
  VARR_char *pVVar11;
  char *pcVar12;
  VARR_pos_t *pVVar13;
  pos_t *ppVar14;
  parse_ctx *ppVar15;
  VARR_stream_t *pVVar16;
  stream_t *ppsVar17;
  VARR_token_t *pVVar18;
  token_t *pptVar19;
  pre_ctx *ppVar20;
  tm *__tp;
  size_t sVar21;
  VARR_char_ptr_t *pVVar22;
  char_ptr_t *ppcVar23;
  VARR_macro_t *pVVar24;
  macro_t *ppmVar25;
  HTAB_macro_t *pHVar26;
  VARR_HTAB_EL_macro_t *pVVar27;
  HTAB_EL_macro_t *pHVar28;
  VARR_htab_ind_t *pVVar29;
  token_t ptVar30;
  VARR_ifstate_t *pVVar31;
  ifstate_t *ppiVar32;
  VARR_macro_call_t *pVVar33;
  macro_call_t *ppmVar34;
  HTAB_tpname_t *pHVar35;
  VARR_HTAB_EL_tpname_t *pVVar36;
  HTAB_EL_tpname_t *pHVar37;
  ulong uVar38;
  check_ctx *pcVar39;
  VARR_node_t *pVVar40;
  node_t_conflict *ppnVar41;
  HTAB_symbol_t *pHVar42;
  VARR_HTAB_EL_symbol_t *pVVar43;
  HTAB_EL_symbol_t *pHVar44;
  HTAB_case_t *pHVar45;
  VARR_HTAB_EL_case_t *pVVar46;
  HTAB_EL_case_t *pHVar47;
  c2m_ctx_t pcVar48;
  VARR_decl_t *pVVar49;
  decl_t *ppdVar50;
  VARR_char_ptr_t *pVVar51;
  undefined1 *puVar52;
  node_t_conflict pnVar53;
  VARR_init_object_t *pVVar54;
  init_object_t *piVar55;
  node_t_conflict pnVar56;
  node_t_conflict pnVar57;
  node_t_conflict op4;
  node *n;
  c2mir_options *pcVar58;
  MIR_module_t_conflict module;
  stream_t psVar59;
  size_t sVar60;
  node *__s;
  code *pcVar61;
  ulong uVar62;
  node_t pnVar63;
  char *fname;
  char cVar64;
  c2m_ctx_t pcVar65;
  code *pcVar66;
  c2m_ctx_t pcVar67;
  c2m_ctx_t pcVar68;
  c2m_ctx_t c2m_ctx;
  long lVar69;
  tpname_t *ptVar70;
  symbol_t *psVar71;
  size_t sVar72;
  char *pcVar73;
  undefined1 auVar74 [16];
  undefined8 uVar81;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined8 uVar90;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined8 in_XMM2_Qb;
  pos_t pos;
  pos_t p;
  pos_t pVar91;
  pos_t pos_00;
  timeval tv;
  time_t t;
  pre_ctx_t pre_ctx;
  time_t time_loc;
  undefined1 local_100 [56];
  double local_c8;
  MIR_context_t local_c0;
  macro_t local_b8;
  node_t_conflict local_b0;
  FILE *local_a8;
  char *local_a0;
  uint local_94;
  c2m_ctx_t local_90;
  pre_ctx *local_88;
  ulong local_80;
  c2m_ctx_t local_78;
  char *local_70;
  node_t_conflict local_68;
  node_t_conflict local_60;
  node_t_conflict local_58;
  node_t_conflict local_50;
  double local_48;
  double local_40;
  time_t local_38;
  undefined1 auVar89 [64];
  
  c2m_ctx = (c2m_ctx_t)ctx->c2mir_ctx;
  local_c0 = ctx;
  local_a8 = (FILE *)output_file;
  local_a0 = source_name;
  gettimeofday((timeval *)local_100,(__timezone_ptr_t)0x0);
  if (c2m_ctx == (c2m_ctx_t)0x0) {
    return 0;
  }
  local_40 = (double)(long)local_100._8_8_;
  local_48 = (double)(long)local_100._0_8_;
  iVar8 = _setjmp((__jmp_buf_tag *)c2m_ctx->env);
  if (iVar8 != 0) {
    compile_finish(c2m_ctx);
    return 0;
  }
  pcVar67 = (c2m_ctx_t)&DAT_00000018;
  c2m_ctx->options = ops;
  c2m_ctx->n_errors = 0;
  c2m_ctx->n_warnings = 0;
  c2m_ctx->c_getc = getc_func;
  c2m_ctx->c_getc_data = getc_data;
  pVVar11 = (VARR_char *)malloc(0x18);
  c2m_ctx->symbol_text = pVVar11;
  if (pVVar11 == (VARR_char *)0x0) goto LAB_00177814;
  pVVar11->els_num = 0;
  pVVar11->size = 0x80;
  pcVar12 = (char *)malloc(0x80);
  pcVar67 = (c2m_ctx_t)&DAT_00000018;
  pVVar11->varr = pcVar12;
  pVVar11 = (VARR_char *)malloc(0x18);
  c2m_ctx->temp_string = pVVar11;
  if (pVVar11 == (VARR_char *)0x0) goto LAB_00177814;
  pVVar11->els_num = 0;
  pVVar11->size = 0x80;
  pcVar12 = (char *)malloc(0x80);
  pcVar67 = (c2m_ctx_t)&DAT_00000018;
  pVVar11->varr = pcVar12;
  pVVar13 = (VARR_pos_t *)malloc(0x18);
  c2m_ctx->node_positions = pVVar13;
  if (pVVar13 == (VARR_pos_t *)0x0) goto LAB_00177814;
  pVVar13->els_num = 0;
  pVVar13->size = 0x80;
  ppVar14 = (pos_t *)malloc(0x800);
  pVVar13->varr = ppVar14;
  ppVar15 = (parse_ctx *)c2mir_calloc(c2m_ctx,0x28);
  pcVar67 = (c2m_ctx_t)&DAT_00000018;
  c2m_ctx->parse_ctx = ppVar15;
  ppVar15->curr_scope = (node_t_conflict)0x0;
  c2m_ctx->error_func = fatal_error;
  ppVar15->record_level = 0;
  c2m_ctx->curr_uid = 0;
  pVVar16 = (VARR_stream_t *)malloc(0x18);
  c2m_ctx->cs = (stream_t)0x0;
  c2m_ctx->eof_s = (stream_t)0x0;
  c2m_ctx->streams = pVVar16;
  if (pVVar16 == (VARR_stream_t *)0x0) goto LAB_00177814;
  pVVar16->els_num = 0;
  pVVar16->size = 0x20;
  ppsVar17 = (stream_t *)malloc(0x100);
  pcVar67 = (c2m_ctx_t)&DAT_00000018;
  pVVar16->varr = ppsVar17;
  pVVar18 = (VARR_token_t *)malloc(0x18);
  c2m_ctx->recorded_tokens = pVVar18;
  if (pVVar18 == (VARR_token_t *)0x0) goto LAB_00177814;
  pVVar18->els_num = 0;
  pVVar18->size = 0x20;
  pptVar19 = (token_t *)malloc(0x100);
  pcVar67 = (c2m_ctx_t)&DAT_00000018;
  pVVar18->varr = pptVar19;
  pVVar18 = (VARR_token_t *)malloc(0x18);
  c2m_ctx->buffered_tokens = pVVar18;
  if (pVVar18 == (VARR_token_t *)0x0) goto LAB_00177814;
  pVVar18->els_num = 0;
  pVVar18->size = 0x20;
  pptVar19 = (token_t *)malloc(0x100);
  pVVar18->varr = pptVar19;
  ppVar20 = (pre_ctx *)c2mir_calloc(c2m_ctx,0x140);
  c2m_ctx->pre_ctx = ppVar20;
  ppVar20->no_out_p = 0;
  ppVar20->skip_if_part_p = 0;
  local_b8 = (macro_t)time(&local_38);
  __tp = localtime_r((time_t *)&local_b8,(tm *)local_100);
  if (__tp == (tm *)0x0) {
    builtin_strncpy(ppVar20->date_str_repr,"\"Unknown date\"",0xf);
    builtin_strncpy(ppVar20->time_str_repr,"\"Unknown time\"",0xf);
  }
  else {
    strftime(ppVar20->date_str_repr,0x32,"\"%b %d %Y\"",__tp);
    strftime(ppVar20->time_str_repr,0x32,"\"%H:%M:%S\"",__tp);
  }
  strcpy(ppVar20->date_str,ppVar20->date_str_repr + 1);
  sVar21 = strlen(ppVar20->date_str);
  pcVar12 = ppVar20->time_str_repr + 1;
  pcVar61 = (code *)0x0;
  ppVar20->date_str[sVar21 - 1] = '\0';
  strcpy(ppVar20->time_str,pcVar12);
  sVar21 = strlen(ppVar20->time_str);
  pcVar67 = (c2m_ctx_t)&DAT_00000018;
  ppVar20->date_str[sVar21 + 0x31] = '\0';
  pVVar22 = (VARR_char_ptr_t *)malloc(0x18);
  ppVar20->once_include_files = pVVar22;
  if (pVVar22 == (VARR_char_ptr_t *)0x0) goto LAB_00177814;
  pVVar22->els_num = 0;
  pVVar22->size = 0x40;
  ppcVar23 = (char_ptr_t *)malloc(0x200);
  pcVar67 = (c2m_ctx_t)&DAT_00000018;
  pVVar22->varr = ppcVar23;
  pVVar18 = (VARR_token_t *)malloc(0x18);
  ppVar20->temp_tokens = pVVar18;
  if (pVVar18 == (VARR_token_t *)0x0) goto LAB_00177814;
  pVVar18->els_num = 0;
  pVVar18->size = 0x80;
  pptVar19 = (token_t *)malloc(0x400);
  pcVar67 = (c2m_ctx_t)&DAT_00000018;
  pVVar18->varr = pptVar19;
  pVVar18 = (VARR_token_t *)malloc(0x18);
  ppVar20->output_buffer = pVVar18;
  if (pVVar18 == (VARR_token_t *)0x0) goto LAB_00177814;
  pVVar18->els_num = 0;
  pVVar18->size = 0x800;
  pptVar19 = (token_t *)malloc(0x4000);
  pVVar18->varr = pptVar19;
  pcVar67 = (c2m_ctx_t)&DAT_00000018;
  ppVar4 = c2m_ctx->pre_ctx;
  pVVar24 = (VARR_macro_t *)malloc(0x18);
  ppVar4->macros = pVVar24;
  if (pVVar24 == (VARR_macro_t *)0x0) goto LAB_00177814;
  pVVar24->els_num = 0;
  pVVar24->size = 0x800;
  ppmVar25 = (macro_t *)malloc(0x4000);
  pcVar67 = (c2m_ctx_t)0x40;
  pVVar24->varr = ppmVar25;
  pHVar26 = (HTAB_macro_t *)malloc(0x40);
  if (pHVar26 == (HTAB_macro_t *)0x0) goto LAB_0017784b;
  pcVar67 = (c2m_ctx_t)&DAT_00000018;
  pVVar27 = (VARR_HTAB_EL_macro_t *)malloc(0x18);
  pHVar26->els = pVVar27;
  if (pVVar27 == (VARR_HTAB_EL_macro_t *)0x0) goto LAB_00177814;
  pcVar68 = (c2m_ctx_t)0x8000;
  pVVar27->els_num = 0;
  pVVar27->size = 0x800;
  pHVar28 = (HTAB_EL_macro_t *)malloc(0x8000);
  pVVar27->varr = pHVar28;
  if (pHVar28 == (HTAB_EL_macro_t *)0x0) {
LAB_00177858:
    c2mir_compile_cold_30();
LAB_0017785d:
    c2mir_compile_cold_26();
LAB_00177862:
    c2mir_compile_cold_24();
LAB_00177867:
    c2mir_compile_cold_22();
LAB_0017786c:
    c2mir_compile_cold_20();
LAB_00177871:
    c2mir_compile_cold_19();
LAB_00177876:
    c2mir_compile_cold_18();
LAB_0017787b:
    c2mir_compile_cold_17();
LAB_00177880:
    c2mir_compile_cold_16();
LAB_00177885:
    c2mir_compile_cold_15();
LAB_0017788a:
    c2mir_compile_cold_14();
LAB_0017788f:
    c2mir_compile_cold_8();
    __s = (node *)pcVar61;
LAB_00177894:
    c2mir_compile_cold_28();
LAB_00177899:
    c2m_ctx = pcVar68;
    c2mir_compile_cold_27();
LAB_0017789e:
    c2mir_compile_cold_12();
  }
  else {
    pcVar67 = (c2m_ctx_t)&DAT_00000018;
    pVVar27->size = 0x800;
    pVVar27->els_num = 0x800;
    pVVar29 = (VARR_htab_ind_t *)malloc(0x18);
    pHVar26->entries = pVVar29;
    if (pVVar29 == (VARR_htab_ind_t *)0x0) goto LAB_00177814;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = local_40;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = local_48;
    auVar89 = ZEXT1664(auVar82);
    uVar62 = 0;
    pVVar29->els_num = 0;
    pVVar29->size = 0x1000;
    auVar74 = vfmadd231sd_fma(auVar74,auVar82,ZEXT816(0x412e848000000000));
    local_c8 = auVar74._0_8_;
    pcVar67 = (c2m_ctx_t)malloc(0x4000);
    pHVar26->arg = (void *)0x0;
    iVar8 = 0x1000;
    pVVar29->varr = (htab_ind_t *)pcVar67;
    pHVar26->hash_func = macro_hash;
    sVar60 = 0x1000;
    pHVar26->eq_func = macro_eq;
    pHVar26->free_func = (_func_void_macro_t_void_ptr *)0x0;
    pHVar26->els_num = 0;
    pHVar26->els_start = 0;
    pHVar26->els_bound = 0;
    pHVar26->collisions = 0;
    do {
      if (pcVar67 == (c2m_ctx_t)0x0) {
        c2mir_compile_cold_29();
        goto LAB_0017781e;
      }
      uVar1 = uVar62 + 1;
      uVar38 = uVar62;
      uVar62 = uVar1;
      if (sVar60 < uVar1) {
        sVar60 = (uVar1 >> 1) + uVar1;
        pcVar67 = (c2m_ctx_t)realloc(pcVar67,sVar60 * 4);
        pVVar29->varr = (htab_ind_t *)pcVar67;
        pVVar29->size = sVar60;
        uVar38 = pVVar29->els_num;
        uVar62 = uVar38 + 1;
      }
      iVar8 = iVar8 + -1;
      *(undefined4 *)((long)pcVar67->env[0].__jmpbuf + uVar38 * 4 + -0x10) = 0xffffffff;
      pVVar29->els_num = uVar62;
    } while (iVar8 != 0);
    ppVar4->macro_tab = pHVar26;
    ptVar30 = new_id_token(c2m_ctx,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"__DATE__");
    new_macro((c2m_ctx_t)c2m_ctx->pre_ctx,ptVar30,(VARR_token_t *)0x0,(VARR_token_t *)0x0);
    ptVar30 = new_id_token(c2m_ctx,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"__TIME__");
    new_macro((c2m_ctx_t)c2m_ctx->pre_ctx,ptVar30,(VARR_token_t *)0x0,(VARR_token_t *)0x0);
    ptVar30 = new_id_token(c2m_ctx,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"__FILE__");
    new_macro((c2m_ctx_t)c2m_ctx->pre_ctx,ptVar30,(VARR_token_t *)0x0,(VARR_token_t *)0x0);
    ptVar30 = new_id_token(c2m_ctx,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"__LINE__");
    new_macro((c2m_ctx_t)c2m_ctx->pre_ctx,ptVar30,(VARR_token_t *)0x0,(VARR_token_t *)0x0);
    if (c2m_ctx->options->pedantic_p == 0) {
      pcVar67 = (c2m_ctx_t)&DAT_00000018;
      pVVar18 = (VARR_token_t *)malloc(0x18);
      if (pVVar18 == (VARR_token_t *)0x0) goto LAB_00177814;
      pVVar18->size = 1;
      pptVar19 = (token_t *)malloc(8);
      __s = (node *)0x1b865c;
      pVVar18->varr = pptVar19;
      pcVar12 = (char *)0x0;
      pcVar68 = c2m_ctx;
      ptVar30 = new_id_token(c2m_ctx,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"$");
      if (pptVar19 == (token_t *)0x0) goto LAB_00177894;
      *pptVar19 = ptVar30;
      pVVar18->els_num = 1;
      ptVar30 = new_id_token(c2m_ctx,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"__has_include");
      new_macro((c2m_ctx_t)c2m_ctx->pre_ctx,ptVar30,pVVar18,(VARR_token_t *)0x0);
      pcVar67 = (c2m_ctx_t)&DAT_00000018;
      pVVar18 = (VARR_token_t *)malloc(0x18);
      if (pVVar18 == (VARR_token_t *)0x0) goto LAB_00177814;
      pVVar18->size = 1;
      pptVar19 = (token_t *)malloc(8);
      __s = (node *)0x1b865c;
      pVVar18->varr = pptVar19;
      pcVar12 = (char *)0x0;
      pcVar68 = c2m_ctx;
      ptVar30 = new_id_token(c2m_ctx,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"$");
      if (pptVar19 != (token_t *)0x0) {
        *pptVar19 = ptVar30;
        pVVar18->els_num = 1;
        ptVar30 = new_id_token(c2m_ctx,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"__has_builtin")
        ;
        new_macro((c2m_ctx_t)c2m_ctx->pre_ctx,ptVar30,pVVar18,(VARR_token_t *)0x0);
        goto LAB_001759d8;
      }
      goto LAB_00177899;
    }
LAB_001759d8:
    pcVar67 = (c2m_ctx_t)&DAT_00000018;
    pVVar31 = (VARR_ifstate_t *)malloc(0x18);
    ppVar20->ifs = pVVar31;
    if (pVVar31 == (VARR_ifstate_t *)0x0) {
LAB_00177814:
      mir_varr_error((char *)pcVar67);
    }
    pVVar31->els_num = 0;
    pVVar31->size = 0x200;
    ppiVar32 = (ifstate_t *)malloc(0x1000);
    pcVar67 = (c2m_ctx_t)&DAT_00000018;
    pVVar31->varr = ppiVar32;
    pVVar33 = (VARR_macro_call_t *)malloc(0x18);
    ppVar20->macro_call_stack = pVVar33;
    if (pVVar33 == (VARR_macro_call_t *)0x0) goto LAB_00177814;
    pVVar33->els_num = 0;
    pVVar33->size = 0x200;
    ppmVar34 = (macro_call_t *)malloc(0x1000);
    pVVar33->varr = ppmVar34;
    str_add((tab_str_t *)local_100,c2m_ctx,"_Bool",6,0x110,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"_Complex",9,0x111,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"_Alignas",9,0x113,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"_Alignof",9,0x112,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"_Atomic",8,0x114,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"_Generic",9,0x115,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"_Noreturn",10,0x116,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"_Static_assert",0xf,0x117,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"_Thread_local",0xe,0x118,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"auto",5,0x11a,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"break",6,0x11b,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"case",5,0x11c,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"char",5,0x11d,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"const",6,0x11e,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"continue",9,0x11f,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"default",8,0x120,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"do",3,0x121,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"double",7,0x122,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"else",5,0x123,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"enum",5,0x124,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"extern",7,0x125,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"float",6,0x126,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"for",4,0x127,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"goto",5,0x128,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"if",3,0x129,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"inline",7,0x12a,3,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"int",4,299,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"long",5,300,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"register",9,0x12d,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"restrict",9,0x12e,2,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"return",7,0x12f,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"short",6,0x130,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"signed",7,0x131,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"sizeof",7,0x132,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"static",7,0x133,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"struct",7,0x134,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"switch",7,0x135,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"typedef",8,0x136,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"typeof",7,0x137,1,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"union",6,0x138,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"unsigned",9,0x139,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"void",5,0x13a,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"volatile",9,0x13b,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"while",6,0x13c,0,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"__restrict",0xb,0x12e,1,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"__restrict__",0xd,0x12e,1,1);
    str_add((tab_str_t *)local_100,c2m_ctx,"__inline",9,0x12a,1,1);
    pcVar61 = (code *)0xb;
    pcVar12 = (char *)c2m_ctx;
    str_add((tab_str_t *)local_100,c2m_ctx,"__inline__",0xb,0x12a,1,1);
    ppVar15 = c2m_ctx->parse_ctx;
    pcVar67 = (c2m_ctx_t)0x40;
    pHVar35 = (HTAB_tpname_t *)malloc(0x40);
    if (pHVar35 == (HTAB_tpname_t *)0x0) goto LAB_0017784b;
    pcVar67 = (c2m_ctx_t)&DAT_00000018;
    pVVar36 = (VARR_HTAB_EL_tpname_t *)malloc(0x18);
    pHVar35->els = pVVar36;
    if (pVVar36 == (VARR_HTAB_EL_tpname_t *)0x0) goto LAB_00177814;
    pcVar68 = (c2m_ctx_t)0x8000;
    pVVar36->els_num = 0;
    pVVar36->size = 0x400;
    pHVar37 = (HTAB_EL_tpname_t *)malloc(0x8000);
    pVVar36->varr = pHVar37;
    if (pHVar37 == (HTAB_EL_tpname_t *)0x0) goto LAB_0017785d;
    pcVar67 = (c2m_ctx_t)&DAT_00000018;
    pVVar36->size = 0x400;
    pVVar36->els_num = 0x400;
    pVVar29 = (VARR_htab_ind_t *)malloc(0x18);
    pHVar35->entries = pVVar29;
    if (pVVar29 == (VARR_htab_ind_t *)0x0) goto LAB_00177814;
    uVar62 = 0;
    pVVar29->els_num = 0;
    pVVar29->size = 0x800;
    pcVar67 = (c2m_ctx_t)malloc(0x2000);
    pHVar35->arg = (void *)0x0;
    iVar8 = 0x800;
    pVVar29->varr = (htab_ind_t *)pcVar67;
    pHVar35->hash_func = tpname_hash;
    sVar60 = 0x800;
    pHVar35->eq_func = tpname_eq;
    pHVar35->free_func = (_func_void_tpname_t_void_ptr *)0x0;
    pHVar35->els_num = 0;
    pHVar35->els_start = 0;
    pHVar35->els_bound = 0;
    pHVar35->collisions = 0;
    do {
      if (pcVar67 == (c2m_ctx_t)0x0) goto LAB_0017781e;
      uVar1 = uVar62 + 1;
      uVar38 = uVar62;
      uVar62 = uVar1;
      if (sVar60 < uVar1) {
        sVar60 = (uVar1 >> 1) + uVar1;
        pcVar67 = (c2m_ctx_t)realloc(pcVar67,sVar60 * 4);
        pVVar29->varr = (htab_ind_t *)pcVar67;
        pVVar29->size = sVar60;
        uVar38 = pVVar29->els_num;
        uVar62 = uVar38 + 1;
      }
      iVar8 = iVar8 + -1;
      *(undefined4 *)((long)pcVar67->env[0].__jmpbuf + uVar38 * 4 + -0x10) = 0xffffffff;
      pVVar29->els_num = uVar62;
    } while (iVar8 != 0);
    ppVar15->tpname_tab = pHVar35;
    pcVar39 = (check_ctx *)c2mir_calloc(c2m_ctx,0x78);
    c2m_ctx->check_ctx = pcVar39;
    pcVar12 = (char *)new_node(c2m_ctx,N_I);
    pcVar61 = (code *)0xffffffffffffffff;
    add_pos(c2m_ctx,(node_t_conflict)pcVar12,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40));
    pcVar67 = (c2m_ctx_t)&DAT_00000018;
    ((c2m_ctx_t)pcVar12)->env[0].__jmpbuf[2] = 1;
    pcVar39->n_i1_node = (node_t_conflict)pcVar12;
    pVVar40 = (VARR_node_t *)malloc(0x18);
    pcVar39->context_stack = pVVar40;
    if (pVVar40 == (VARR_node_t *)0x0) goto LAB_00177814;
    pVVar40->els_num = 0;
    pVVar40->size = 0x40;
    ppnVar41 = (node_t_conflict *)malloc(0x200);
    pVVar40->varr = ppnVar41;
    check(c2m_ctx,(node_t_conflict)pcVar12,(node_t_conflict)0x0);
    pcVar67 = (c2m_ctx_t)&DAT_00000018;
    pcVar39->curr_scope = (node_t_conflict)0x0;
    pcVar39->func_block_scope = (node_t_conflict)0x0;
    pVVar40 = (VARR_node_t *)malloc(0x18);
    pcVar39->label_uses = pVVar40;
    if (pVVar40 == (VARR_node_t *)0x0) goto LAB_00177814;
    pVVar40->els_num = 0;
    pVVar40->size = 0x40;
    ppnVar41 = (node_t_conflict *)malloc(0x200);
    pcVar67 = (c2m_ctx_t)0x40;
    pVVar40->varr = ppnVar41;
    pHVar42 = (HTAB_symbol_t *)malloc(0x40);
    if (pHVar42 == (HTAB_symbol_t *)0x0) {
LAB_0017784b:
      mir_htab_error((char *)pcVar67);
    }
    pcVar67 = (c2m_ctx_t)&DAT_00000018;
    pVVar43 = (VARR_HTAB_EL_symbol_t *)malloc(0x18);
    pHVar42->els = pVVar43;
    if (pVVar43 == (VARR_HTAB_EL_symbol_t *)0x0) goto LAB_00177814;
    pcVar68 = (c2m_ctx_t)0x70000;
    pVVar43->els_num = 0;
    pVVar43->size = 0x2000;
    pHVar44 = (HTAB_EL_symbol_t *)malloc(0x70000);
    pVVar43->varr = pHVar44;
    if (pHVar44 == (HTAB_EL_symbol_t *)0x0) goto LAB_00177862;
    pcVar67 = (c2m_ctx_t)&DAT_00000018;
    pVVar43->size = 0x2000;
    pVVar43->els_num = 0x2000;
    pVVar29 = (VARR_htab_ind_t *)malloc(0x18);
    pHVar42->entries = pVVar29;
    if (pVVar29 == (VARR_htab_ind_t *)0x0) goto LAB_00177814;
    pcVar68 = (c2m_ctx_t)0x0;
    pVVar29->els_num = 0;
    pVVar29->size = 0x4000;
    pcVar67 = (c2m_ctx_t)malloc(0x10000);
    pHVar42->arg = (void *)0x0;
    pcVar66 = symbol_eq;
    iVar8 = 0x4000;
    pVVar29->varr = (htab_ind_t *)pcVar67;
    pHVar42->hash_func = symbol_hash;
    pcVar61 = (code *)0x4000;
    pHVar42->eq_func = symbol_eq;
    pHVar42->free_func = symbol_clear;
    pHVar42->els_num = 0;
    pHVar42->els_start = 0;
    pHVar42->els_bound = 0;
    pHVar42->collisions = 0;
    do {
      if (pcVar67 == (c2m_ctx_t)0x0) goto LAB_00177823;
      pcVar65 = (c2m_ctx_t)((long)&pcVar68->ctx + 1);
      pcVar48 = pcVar68;
      pcVar68 = pcVar65;
      pcVar12 = (char *)pcVar66;
      if (pcVar61 < pcVar65) {
        pcVar61 = (code *)((long)pcVar65->env[0].__jmpbuf + (((ulong)pcVar65 >> 1) - 0x10));
        pcVar67 = (c2m_ctx_t)realloc(pcVar67,(long)pcVar61 * 4);
        pVVar29->varr = (htab_ind_t *)pcVar67;
        pVVar29->size = (size_t)pcVar61;
        pcVar48 = (c2m_ctx_t)pVVar29->els_num;
        pcVar68 = (c2m_ctx_t)((long)&pcVar48->ctx + 1);
        pcVar12 = (char *)pcVar48;
      }
      iVar8 = iVar8 + -1;
      *(undefined4 *)((long)pcVar67->env[0].__jmpbuf + (long)pcVar48 * 4 + -0x10) = 0xffffffff;
      pVVar29->els_num = (size_t)pcVar68;
      pcVar66 = (code *)pcVar12;
    } while (iVar8 != 0);
    pcVar67 = (c2m_ctx_t)0x40;
    c2m_ctx->symbol_tab = pHVar42;
    pcVar39->in_params_p = '\0';
    pcVar39->curr_unnamed_anon_struct_union_member = (node_t_conflict)0x0;
    pHVar45 = (HTAB_case_t *)malloc(0x40);
    if (pHVar45 == (HTAB_case_t *)0x0) goto LAB_0017784b;
    pcVar67 = (c2m_ctx_t)&DAT_00000018;
    pVVar46 = (VARR_HTAB_EL_case_t *)malloc(0x18);
    pHVar45->els = pVVar46;
    if (pVVar46 == (VARR_HTAB_EL_case_t *)0x0) goto LAB_00177814;
    pcVar68 = (c2m_ctx_t)0x800;
    pVVar46->els_num = 0;
    pVVar46->size = 0x80;
    pHVar47 = (HTAB_EL_case_t *)malloc(0x800);
    pVVar46->varr = pHVar47;
    if (pHVar47 == (HTAB_EL_case_t *)0x0) goto LAB_00177867;
    pcVar67 = (c2m_ctx_t)&DAT_00000018;
    pVVar46->size = 0x80;
    pVVar46->els_num = 0x80;
    pVVar29 = (VARR_htab_ind_t *)malloc(0x18);
    pHVar45->entries = pVVar29;
    if (pVVar29 == (VARR_htab_ind_t *)0x0) goto LAB_00177814;
    pcVar68 = (c2m_ctx_t)0x0;
    pVVar29->els_num = 0;
    pVVar29->size = 0x100;
    pcVar67 = (c2m_ctx_t)malloc(0x400);
    pHVar45->arg = (void *)0x0;
    uVar81 = 0;
    iVar8 = 0x100;
    pVVar29->varr = (htab_ind_t *)pcVar67;
    pHVar45->hash_func = case_hash;
    pcVar61 = (code *)0x100;
    pHVar45->eq_func = case_eq;
    pHVar45->free_func = (_func_void_case_t_void_ptr *)0x0;
    pHVar45->els_num = 0;
    pHVar45->els_start = 0;
    pHVar45->els_bound = 0;
    pHVar45->collisions = 0;
    do {
      if (pcVar67 == (c2m_ctx_t)0x0) goto LAB_00177828;
      pcVar65 = (c2m_ctx_t)((long)&pcVar68->ctx + 1);
      pcVar48 = pcVar68;
      pcVar68 = pcVar65;
      if (pcVar61 < pcVar65) {
        pcVar61 = (code *)((long)pcVar65->env[0].__jmpbuf + (((ulong)pcVar65 >> 1) - 0x10));
        pcVar67 = (c2m_ctx_t)realloc(pcVar67,(long)pcVar61 * 4);
        pVVar29->varr = (htab_ind_t *)pcVar67;
        pVVar29->size = (size_t)pcVar61;
        pcVar48 = (c2m_ctx_t)pVVar29->els_num;
        pcVar68 = (c2m_ctx_t)((long)&pcVar48->ctx + 1);
        pcVar12 = (char *)pcVar48;
      }
      iVar8 = iVar8 + -1;
      *(undefined4 *)((long)pcVar67->env[0].__jmpbuf + (long)pcVar48 * 4 + -0x10) = 0xffffffff;
      pVVar29->els_num = (size_t)pcVar68;
    } while (iVar8 != 0);
    pcVar67 = (c2m_ctx_t)&DAT_00000018;
    pcVar39->case_tab = pHVar45;
    pVVar49 = (VARR_decl_t *)malloc(0x18);
    pcVar39->func_decls_for_allocation = pVVar49;
    if (pVVar49 == (VARR_decl_t *)0x0) goto LAB_00177814;
    pVVar49->els_num = 0;
    pVVar49->size = 0x400;
    ppdVar50 = (decl_t *)malloc(0x2000);
    pcVar67 = (c2m_ctx_t)&DAT_00000018;
    pVVar49->varr = ppdVar50;
    pVVar40 = (VARR_node_t *)malloc(0x18);
    pcVar39->possible_incomplete_decls = pVVar40;
    if (pVVar40 == (VARR_node_t *)0x0) goto LAB_00177814;
    pVVar40->els_num = 0;
    pVVar40->size = 0x200;
    ppnVar41 = (node_t_conflict *)malloc(0x1000);
    pcVar67 = (c2m_ctx_t)&DAT_00000018;
    pVVar40->varr = ppnVar41;
    pVVar22 = (VARR_char_ptr_t *)malloc(0x18);
    c2m_ctx->headers = pVVar22;
    if (pVVar22 == (VARR_char_ptr_t *)0x0) goto LAB_00177814;
    pVVar22->els_num = 0;
    pVVar22->size = 0x40;
    pcVar68 = (c2m_ctx_t)malloc(0x200);
    pcVar67 = (c2m_ctx_t)&DAT_00000018;
    pVVar22->varr = (char_ptr_t *)pcVar68;
    pVVar51 = (VARR_char_ptr_t *)malloc(0x18);
    c2m_ctx->system_headers = pVVar51;
    if (pVVar51 == (VARR_char_ptr_t *)0x0) goto LAB_00177814;
    pVVar51->els_num = 0;
    pVVar51->size = 0x40;
    ppcVar23 = (char_ptr_t *)malloc(0x200);
    pVVar51->varr = ppcVar23;
    pcVar58 = c2m_ctx->options;
    if (pcVar58->include_dirs_num == 0) {
      sVar60 = 0;
    }
    else {
      pcVar61 = (code *)0x0;
      do {
        pVVar22 = c2m_ctx->headers;
        pcVar67 = (c2m_ctx_t)pVVar22->varr;
        if (pcVar67 == (c2m_ctx_t)0x0) goto LAB_00177832;
        sVar60 = pVVar22->els_num;
        pcVar12 = pcVar58->include_dirs[(long)pcVar61];
        uVar62 = sVar60 + 1;
        if (pVVar22->size < uVar62) {
          sVar60 = (uVar62 >> 1) + uVar62;
          pcVar67 = (c2m_ctx_t)realloc(pcVar67,sVar60 * 8);
          pVVar22->varr = (char_ptr_t *)pcVar67;
          pVVar22->size = sVar60;
          sVar60 = pVVar22->els_num;
          uVar62 = sVar60 + 1;
        }
        pVVar22->els_num = uVar62;
        pcVar67->env[0].__jmpbuf[sVar60 - 2] = (long)pcVar12;
        pVVar22 = c2m_ctx->system_headers;
        pcVar67 = (c2m_ctx_t)pVVar22->varr;
        if (pcVar67 == (c2m_ctx_t)0x0) goto LAB_00177837;
        sVar60 = pVVar22->els_num;
        pcVar12 = c2m_ctx->options->include_dirs[(long)pcVar61];
        uVar62 = sVar60 + 1;
        if (pVVar22->size < uVar62) {
          sVar60 = (uVar62 >> 1) + uVar62;
          pcVar67 = (c2m_ctx_t)realloc(pcVar67,sVar60 * 8);
          pVVar22->varr = (char_ptr_t *)pcVar67;
          pVVar22->size = sVar60;
          sVar60 = pVVar22->els_num;
          uVar62 = sVar60 + 1;
        }
        pVVar22->els_num = uVar62;
        pcVar67->env[0].__jmpbuf[sVar60 - 2] = (long)pcVar12;
        pcVar61 = (code *)((long)&((c2m_ctx_t)pcVar61)->ctx + 1);
        pcVar58 = c2m_ctx->options;
      } while (pcVar61 < (c2m_ctx_t)pcVar58->include_dirs_num);
      pVVar22 = c2m_ctx->headers;
      sVar60 = pVVar22->els_num;
      pcVar68 = (c2m_ctx_t)pVVar22->varr;
      pcVar12 = (char *)c2m_ctx;
    }
    if (pcVar68 == (c2m_ctx_t)0x0) goto LAB_0017786c;
    pcVar61 = (code *)(sVar60 + 1);
    if ((c2m_ctx_t)pVVar22->size < pcVar61) {
      sVar60 = (long)((c2m_ctx_t)pcVar61)->env[0].__jmpbuf + (((ulong)pcVar61 >> 1) - 0x10);
      pcVar12 = (char *)(sVar60 * 8);
      pcVar68 = (c2m_ctx_t)realloc(pcVar68,(size_t)pcVar12);
      pVVar22->varr = (char_ptr_t *)pcVar68;
      pVVar22->size = sVar60;
      sVar60 = pVVar22->els_num;
      pcVar61 = (code *)(sVar60 + 1);
    }
    pVVar22->els_num = (size_t)pcVar61;
    pcVar68->env[0].__jmpbuf[sVar60 - 2] = 0;
    pVVar22 = c2m_ctx->system_headers;
    pcVar68 = (c2m_ctx_t)pVVar22->varr;
    if (pcVar68 == (c2m_ctx_t)0x0) goto LAB_00177871;
    pcVar61 = (code *)pVVar22->els_num;
    puVar52 = (undefined1 *)((long)&((c2m_ctx_t)pcVar61)->ctx + 1);
    if ((undefined1 *)pVVar22->size < puVar52) {
      pcVar68 = (c2m_ctx_t)realloc(pcVar68,(long)(puVar52 + ((ulong)puVar52 >> 1)) * 8);
      pVVar22->varr = (char_ptr_t *)pcVar68;
      pVVar22->size = (size_t)(puVar52 + ((ulong)puVar52 >> 1));
      pcVar61 = (code *)pVVar22->els_num;
      puVar52 = (undefined1 *)((long)&((c2m_ctx_t)pcVar61)->ctx + 1);
    }
    pcVar12 = "/usr/local/include";
    pVVar22->els_num = (size_t)puVar52;
    pcVar68->env[0].__jmpbuf[(long)((long)&((c2m_ctx_t)((long)pcVar61 + -0x208))->gen_ctx + 6)] =
         (long)"/usr/local/include";
    pVVar22 = c2m_ctx->system_headers;
    pcVar68 = (c2m_ctx_t)pVVar22->varr;
    if (pcVar68 == (c2m_ctx_t)0x0) goto LAB_00177876;
    pcVar61 = (code *)pVVar22->els_num;
    puVar52 = (undefined1 *)((long)&((c2m_ctx_t)pcVar61)->ctx + 1);
    if ((undefined1 *)pVVar22->size < puVar52) {
      pcVar68 = (c2m_ctx_t)realloc(pcVar68,(long)(puVar52 + ((ulong)puVar52 >> 1)) * 8);
      pVVar22->varr = (char_ptr_t *)pcVar68;
      pVVar22->size = (size_t)(puVar52 + ((ulong)puVar52 >> 1));
      pcVar61 = (code *)pVVar22->els_num;
      puVar52 = (undefined1 *)((long)&((c2m_ctx_t)pcVar61)->ctx + 1);
    }
    pcVar12 = "/usr/include/x86_64-linux-gnu";
    pVVar22->els_num = (size_t)puVar52;
    pcVar68->env[0].__jmpbuf[(long)((long)&((c2m_ctx_t)((long)pcVar61 + -0x208))->gen_ctx + 6)] =
         (long)"/usr/include/x86_64-linux-gnu";
    pVVar22 = c2m_ctx->system_headers;
    pcVar68 = (c2m_ctx_t)pVVar22->varr;
    if (pcVar68 == (c2m_ctx_t)0x0) goto LAB_0017787b;
    pcVar61 = (code *)pVVar22->els_num;
    puVar52 = (undefined1 *)((long)&((c2m_ctx_t)pcVar61)->ctx + 1);
    if ((undefined1 *)pVVar22->size < puVar52) {
      pcVar68 = (c2m_ctx_t)realloc(pcVar68,(long)(puVar52 + ((ulong)puVar52 >> 1)) * 8);
      pVVar22->varr = (char_ptr_t *)pcVar68;
      pVVar22->size = (size_t)(puVar52 + ((ulong)puVar52 >> 1));
      pcVar61 = (code *)pVVar22->els_num;
      puVar52 = (undefined1 *)((long)&((c2m_ctx_t)pcVar61)->ctx + 1);
    }
    pcVar12 = "/usr/include";
    pVVar22->els_num = (size_t)puVar52;
    pcVar68->env[0].__jmpbuf[(long)((long)&((c2m_ctx_t)((long)pcVar61 + -0x208))->gen_ctx + 6)] =
         (long)"/usr/include";
    pVVar22 = c2m_ctx->system_headers;
    pcVar68 = (c2m_ctx_t)pVVar22->varr;
    if (pcVar68 == (c2m_ctx_t)0x0) goto LAB_00177880;
    pcVar61 = (code *)pVVar22->els_num;
    puVar52 = (undefined1 *)((long)&((c2m_ctx_t)pcVar61)->ctx + 1);
    if ((undefined1 *)pVVar22->size < puVar52) {
      pcVar12 = (char *)((long)(puVar52 + ((ulong)puVar52 >> 1)) * 8);
      pcVar68 = (c2m_ctx_t)realloc(pcVar68,(size_t)pcVar12);
      pVVar22->varr = (char_ptr_t *)pcVar68;
      pVVar22->size = (size_t)(puVar52 + ((ulong)puVar52 >> 1));
      pcVar61 = (code *)pVVar22->els_num;
      puVar52 = (undefined1 *)((long)&((c2m_ctx_t)pcVar61)->ctx + 1);
    }
    uVar90 = auVar89._8_8_;
    pVVar22->els_num = (size_t)puVar52;
    pcVar68->env[0].__jmpbuf[(long)((long)&((c2m_ctx_t)((long)pcVar61 + -0x208))->gen_ctx + 6)] = 0;
    if (c2m_ctx->headers == (VARR_char_ptr_t *)0x0) goto LAB_00177885;
    c2m_ctx->header_dirs = c2m_ctx->headers->varr;
    if (c2m_ctx->system_headers == (VARR_char_ptr_t *)0x0) goto LAB_0017788a;
    c2m_ctx->system_header_dirs = c2m_ctx->system_headers->varr;
    pcVar58 = c2m_ctx->options;
    if (pcVar58->macro_commands_num != 0) {
      uVar62 = 0;
      do {
        pcVar12 = pcVar58->macro_commands[uVar62].name;
        pcVar73 = pcVar58->macro_commands[uVar62].def;
        local_88 = c2m_ctx->pre_ctx;
        local_80 = uVar62;
        if (pcVar73 == (char *)0x0) {
          pVar91.lno = 1;
          pVar91.ln_pos = 0;
          pVar91.fname = "<command-line>";
          pnVar53 = (node_t_conflict)new_id_token(c2m_ctx,pVar91,pcVar12);
          iVar8 = check_id_p(c2m_ctx,(char *)(pnVar53->u).ops.tail);
          if (iVar8 != 0) {
            local_100._0_8_ = pnVar53;
            HTAB_macro_t_do(local_88->macro_tab,(macro_t)local_100,HTAB_DELETE,&local_b8);
          }
        }
        else {
          pcVar67 = (c2m_ctx_t)&DAT_00000018;
          pVVar18 = (VARR_token_t *)malloc(0x18);
          if (pVVar18 == (VARR_token_t *)0x0) goto LAB_00177814;
          pVVar18->els_num = 0;
          pVVar18->size = 0x10;
          pptVar19 = (token_t *)malloc(0x80);
          pVVar18->varr = pptVar19;
          pos_00.lno = 1;
          pos_00.ln_pos = 0;
          pos_00.fname = "<command-line>";
          pcVar67 = c2m_ctx;
          pnVar53 = (node_t_conflict)new_id_token(c2m_ctx,pos_00,pcVar12);
          pVVar11 = c2m_ctx->temp_string;
          if ((pVVar11 == (VARR_char *)0x0) || (pcVar12 = pVVar11->varr, pcVar12 == (char *)0x0))
          goto LAB_0017782d;
          pVVar11->els_num = 0;
          cVar64 = *pcVar73;
          if (cVar64 == '\0') {
            sVar60 = 1;
            sVar72 = 0;
          }
          else {
            do {
              local_60 = pnVar53;
              pcVar73 = pcVar73 + 1;
              pVVar11 = c2m_ctx->temp_string;
              pcVar67 = (c2m_ctx_t)pVVar11->varr;
              if (pcVar67 == (c2m_ctx_t)0x0) {
                c2mir_compile_cold_4();
                goto LAB_0017780f;
              }
              sVar60 = pVVar11->els_num;
              uVar62 = sVar60 + 1;
              if (pVVar11->size < uVar62) {
                sVar21 = (uVar62 >> 1) + uVar62;
                pcVar67 = (c2m_ctx_t)realloc(pcVar67,sVar21);
                pVVar11->varr = (char *)pcVar67;
                pVVar11->size = sVar21;
                sVar60 = pVVar11->els_num;
                uVar62 = sVar60 + 1;
              }
              pVVar11->els_num = uVar62;
              *(char *)((long)pcVar67->env[0].__jmpbuf + (sVar60 - 0x10)) = cVar64;
              cVar64 = *pcVar73;
              pnVar53 = local_60;
            } while (cVar64 != '\0');
            pVVar11 = c2m_ctx->temp_string;
            pcVar12 = pVVar11->varr;
            if (pcVar12 == (char *)0x0) goto LAB_00177841;
            sVar72 = pVVar11->els_num;
            sVar60 = sVar72 + 1;
          }
          if (pVVar11->size < sVar60) {
            sVar21 = (sVar60 >> 1) + sVar60;
            pcVar12 = (char *)realloc(pcVar12,sVar21);
            pVVar11->varr = pcVar12;
            pVVar11->size = sVar21;
            sVar72 = pVVar11->els_num;
            sVar60 = sVar72 + 1;
          }
          pVVar11->els_num = sVar60;
          pcVar12[sVar72] = '\0';
          pcVar67 = (c2m_ctx_t)c2m_ctx->temp_string;
          reverse((VARR_char *)pcVar67);
          if (c2m_ctx->temp_string == (VARR_char *)0x0) goto LAB_0017783c;
          pos.lno = 1;
          pos.ln_pos = 0;
          pos.fname = "<command-line>";
          local_68 = pnVar53;
          set_string_stream(c2m_ctx,c2m_ctx->temp_string->varr,pos,
                            (_func_void_char_ptr_VARR_char_ptr *)0x0);
          while( true ) {
            ptVar30 = get_next_pptoken_1(c2m_ctx,0);
            pnVar53 = local_68;
            if ((*(short *)ptVar30 == 0x13d) || (*(short *)ptVar30 == 0x147)) break;
            pcVar67 = (c2m_ctx_t)pVVar18->varr;
            if (pcVar67 == (c2m_ctx_t)0x0) goto LAB_0017780f;
            sVar60 = pVVar18->els_num;
            uVar62 = sVar60 + 1;
            if (pVVar18->size < uVar62) {
              sVar72 = (uVar62 >> 1) + uVar62;
              pcVar67 = (c2m_ctx_t)realloc(pcVar67,sVar72 * 8);
              pVVar18->varr = (token_t *)pcVar67;
              pVVar18->size = sVar72;
            }
            pVVar18->els_num = uVar62;
            pcVar67->env[0].__jmpbuf[sVar60 - 2] = (long)ptVar30;
          }
          iVar8 = check_id_p(c2m_ctx,(char *)(local_68->u).ops.tail);
          ppVar20 = local_88;
          if (iVar8 != 0) {
            local_100._0_8_ = pnVar53;
            iVar8 = HTAB_macro_t_do(local_88->macro_tab,(macro_t)local_100,HTAB_FIND,&local_b8);
            if (iVar8 != 0) {
              iVar8 = replacement_eq_p(local_b8->replacement,pVVar18);
              if ((iVar8 == 0) &&
                 (pFVar5 = (FILE *)c2m_ctx->options->message_file, pFVar5 != (FILE *)0x0)) {
                fprintf(pFVar5,"warning -- redefinition of macro %s on the command line\n",
                        (char *)(pnVar53->u).s.len);
              }
              HTAB_macro_t_do(ppVar20->macro_tab,(macro_t)local_100,HTAB_DELETE,&local_b8);
            }
            new_macro((c2m_ctx_t)c2m_ctx->pre_ctx,(token_t)local_100._0_8_,(VARR_token_t *)0x0,
                      pVVar18);
          }
        }
        uVar90 = auVar89._8_8_;
        pcVar58 = c2m_ctx->options;
        uVar62 = local_80 + 1;
      } while (uVar62 < pcVar58->macro_commands_num);
    }
    pcVar67 = (c2m_ctx_t)&DAT_00000018;
    pVVar40 = (VARR_node_t *)malloc(0x18);
    c2m_ctx->call_nodes = pVVar40;
    if (pVVar40 == (VARR_node_t *)0x0) goto LAB_00177814;
    pVVar40->els_num = 0;
    pVVar40->size = 0x80;
    ppnVar41 = (node_t_conflict *)malloc(0x400);
    pcVar67 = (c2m_ctx_t)&DAT_00000018;
    pVVar40->varr = ppnVar41;
    pVVar40 = (VARR_node_t *)malloc(0x18);
    c2m_ctx->containing_anon_members = pVVar40;
    if (pVVar40 == (VARR_node_t *)0x0) goto LAB_00177814;
    pVVar40->els_num = 0;
    pVVar40->size = 8;
    ppnVar41 = (node_t_conflict *)malloc(0x40);
    pcVar67 = (c2m_ctx_t)&DAT_00000018;
    pVVar40->varr = ppnVar41;
    pVVar54 = (VARR_init_object_t *)malloc(0x18);
    c2m_ctx->init_object_path = pVVar54;
    if (pVVar54 == (VARR_init_object_t *)0x0) goto LAB_00177814;
    pVVar54->els_num = 0;
    pVVar54->size = 8;
    piVar55 = (init_object_t *)malloc(0xc0);
    pVVar54->varr = piVar55;
    if ((pcVar58->verbose_p != 0) && (pFVar5 = (FILE *)pcVar58->message_file, pFVar5 != (FILE *)0x0)
       ) {
      gettimeofday((timeval *)local_100,(__timezone_ptr_t)0x0);
      auVar75._0_8_ = (double)(long)local_100._8_8_;
      auVar75._8_8_ = uVar81;
      auVar83._0_8_ = (double)(long)local_100._0_8_;
      auVar83._8_8_ = uVar90;
      vfmadd132sd_fma(auVar83,auVar75,ZEXT816(0x412e848000000000));
      fprintf(pFVar5,"C2MIR init end           -- %.0f usec\n");
    }
    pcVar61 = top_level_getc;
    pcVar12 = (char *)0x0;
    pcVar68 = c2m_ctx;
    add_stream(c2m_ctx,(FILE *)0x0,local_a0,top_level_getc);
    if (c2m_ctx->options->no_prepro_p == 0) {
      lVar69 = 8;
      do {
        if (*(long *)(&UNK_001e3ce8 + lVar69) == 0) {
          pcVar73 = *(char **)((long)&standard_includes[0].name + lVar69);
          pcVar61 = str_getc;
          pcVar12 = (char *)(c2m_ctx_t)0x0;
          pcVar68 = c2m_ctx;
          add_stream(c2m_ctx,(FILE *)0x0,"<environment>",str_getc);
          psVar59 = c2m_ctx->cs;
          psVar59->curr = pcVar73;
          psVar59->start = pcVar73;
        }
        lVar69 = lVar69 + 0x10;
      } while (lVar69 != 0xb8);
    }
    ppVar20 = c2m_ctx->pre_ctx;
    ppVar20->pre_last_token = (token_t)0x0;
    (ppVar20->actual_pre_pos).fname = (char *)0x0;
    (ppVar20->actual_pre_pos).lno = 0;
    (ppVar20->actual_pre_pos).ln_pos = 0;
    ppVar20->pptokens_num = 0;
    ppVar20->pre_out_token_func = common_pre_out;
    pVVar22 = ppVar20->once_include_files;
    if ((pVVar22 == (VARR_char_ptr_t *)0x0) || (pVVar22->varr == (char_ptr_t *)0x0)) {
      c2mir_compile_cold_13();
      goto LAB_00177858;
    }
    pVVar22->els_num = 0;
    if (c2m_ctx->options->no_prepro_p == 0) {
      processing(c2m_ctx,0);
    }
    else {
      while( true ) {
        ptVar30 = get_next_pptoken_1(c2m_ctx,0);
        uVar2 = *(ushort *)ptVar30;
        pcVar61 = (code *)(ulong)uVar2;
        if ((uVar2 == 0x13d) || (uVar2 == 0x147)) break;
        (*ppVar20->pre_out_token_func)(c2m_ctx,ptVar30);
      }
    }
    pcVar12 = (char *)0x0;
    (*ppVar20->pre_out_token_func)(c2m_ctx,(token_t)0x0);
    pcVar58 = c2m_ctx->options;
    if ((pcVar58->verbose_p != 0) &&
       (pcVar68 = (c2m_ctx_t)pcVar58->message_file, pcVar68 != (c2m_ctx_t)0x0)) {
      if (c2m_ctx->recorded_tokens == (VARR_token_t *)0x0) goto LAB_0017788f;
      fprintf((FILE *)pcVar68,"    preprocessor tokens -- %lu, parse tokens -- %lu\n",
              ppVar20->pptokens_num,c2m_ctx->recorded_tokens->els_num);
      pcVar58 = c2m_ctx->options;
      if ((pcVar58->verbose_p != 0) &&
         (pFVar5 = (FILE *)pcVar58->message_file, pFVar5 != (FILE *)0x0)) {
        gettimeofday((timeval *)local_100,(__timezone_ptr_t)0x0);
        auVar76._0_8_ = (double)(long)local_100._8_8_;
        auVar76._8_8_ = in_XMM2_Qb;
        auVar84._0_8_ = (double)(long)local_100._0_8_;
        auVar84._8_8_ = in_XMM2_Qb;
        auVar74 = vfmadd132sd_fma(auVar84,auVar76,ZEXT816(0x412e848000000000));
        fprintf(pFVar5,"  C2MIR preprocessor end    -- %.0f usec\n",auVar74._0_8_ - local_c8);
        pcVar58 = c2m_ctx->options;
      }
    }
    if (pcVar58->prepro_only_p != 0) {
LAB_0017744c:
      compile_finish(c2m_ctx);
      if ((c2m_ctx->options->verbose_p != 0) &&
         (pFVar5 = (FILE *)c2m_ctx->options->message_file, pFVar5 != (FILE *)0x0)) {
        gettimeofday((timeval *)local_100,(__timezone_ptr_t)0x0);
        auVar78._0_8_ = (double)(long)local_100._8_8_;
        auVar78._8_8_ = in_XMM2_Qb;
        auVar86._0_8_ = (double)(long)local_100._0_8_;
        auVar86._8_8_ = in_XMM2_Qb;
        auVar74 = vfmadd132sd_fma(auVar86,auVar78,ZEXT816(0x412e848000000000));
        fprintf(pFVar5,"C2MIR compiler end                -- %.0f usec\n",auVar74._0_8_ - local_c8);
      }
      return (uint)(c2m_ctx->n_errors == 0);
    }
    ppVar15 = c2m_ctx->parse_ctx;
    ppVar15->next_token_index = 0;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    pnVar53 = new_node(c2m_ctx,N_LIST);
    __s = (node *)ppVar15->curr_token;
    sVar3 = *(short *)&((c2m_ctx_t)__s)->ctx;
    pnVar57 = pnVar53;
    pnVar56 = local_50;
    while (local_50 = pnVar57, sVar3 != 0x13d) {
      sVar60 = record_start((c2m_ctx_t)c2m_ctx->parse_ctx);
      pnVar56 = declaration(c2m_ctx,1);
      record_stop(c2m_ctx,sVar60,(uint)(pnVar56 == &err_struct));
      if (pnVar56 == &err_struct) {
        pnVar56 = declaration_specs(c2m_ctx,0,(node_t_conflict)&DAT_00000001);
        if ((pnVar56 != &err_struct) && (pnVar57 = declarator(c2m_ctx,0), pnVar57 != &err_struct)) {
          local_58 = pnVar56;
          pnVar56 = new_node(c2m_ctx,N_LIST);
          pnVar57->attr = ppVar15->curr_scope;
          ppVar15->curr_scope = pnVar57;
          local_b0 = pnVar57;
          while (*(short *)ppVar15->curr_token != 0x7b) {
            pnVar57 = declaration(c2m_ctx,0);
            if (pnVar57 == &err_struct) {
              ppVar15->curr_scope = (node_t_conflict)local_b0->attr;
              goto LAB_00177373;
            }
            op_flat_append(c2m_ctx,pnVar56,pnVar57);
          }
          pnVar6 = (local_b0->u).ops.head;
          pnVar63 = (((pnVar6->op_link).next)->u).ops.head;
          if ((pnVar63 == (node_t)0x0) || (pnVar63->code != N_FUNC)) {
            pVar91 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                  (node_t_conflict)(ulong)pnVar6->uid);
            error(c2m_ctx,0x1c1ae2,pVar91.fname,pVar91._8_8_,(pnVar6->u).s.s);
          }
          else {
            for (pnVar6 = (((pnVar63->u).ops.head)->u).ops.head; pnVar6 != (node_t)0x0;
                pnVar6 = (pnVar6->op_link).next) {
              if (pnVar6->code == N_SPEC_DECL) {
                pnVar53 = ppVar15->curr_scope;
                pcVar67 = (c2m_ctx_t)c2m_ctx->parse_ctx;
                pnVar63 = (((((pnVar6->u).ops.head)->op_link).next)->u).ops.head;
LAB_00177286:
                tpname_add((tpname_t *)local_100,pcVar67,pnVar63,pnVar53,0);
              }
              else if (pnVar6->code == N_ID) {
                pnVar53 = ppVar15->curr_scope;
                pcVar67 = (c2m_ctx_t)c2m_ctx->parse_ctx;
                pnVar63 = pnVar6;
                goto LAB_00177286;
              }
            }
          }
          pcVar12 = (char *)0x0;
          op4 = compound_stmt(c2m_ctx,0);
          pnVar57 = local_58;
          pnVar53 = local_b0;
          __s = &err_struct;
          if (op4 != &err_struct) {
            pVar91 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                  (node_t_conflict)(ulong)local_b0->uid);
            local_78 = pVar91._8_8_;
            local_70 = pVar91.fname;
            pnVar56 = new_node4(c2m_ctx,N_FUNC_DEF,pnVar57,pnVar53,pnVar56,op4);
            p._8_8_ = local_78;
            p.fname = local_70;
            __s = (node *)local_78;
            add_pos(c2m_ctx,pnVar56,p);
            ppVar15->curr_scope = (node_t_conflict)pnVar53->attr;
            pnVar53 = local_50;
            goto LAB_00177159;
          }
          n = &err_struct;
          goto LAB_001773bd;
        }
LAB_00177373:
        __s = &err_struct;
        error_recovery(c2m_ctx,0,"<declarator>");
      }
      else {
LAB_00177159:
        op_flat_append(c2m_ctx,pnVar53,pnVar56);
      }
      pnVar57 = local_50;
      pnVar56 = local_50;
      sVar3 = *(short *)ppVar15->curr_token;
    }
    local_50 = pnVar56;
    n = new_node(c2m_ctx,N_MODULE);
    pcVar12 = (char *)n;
    op_append(c2m_ctx,n,pnVar53);
LAB_001773bd:
    pcVar58 = c2m_ctx->options;
    if ((pcVar58->verbose_p != 0) && (pFVar5 = (FILE *)pcVar58->message_file, pFVar5 != (FILE *)0x0)
       ) {
      gettimeofday((timeval *)local_100,(__timezone_ptr_t)0x0);
      auVar77._0_8_ = (double)(long)local_100._8_8_;
      auVar77._8_8_ = in_XMM2_Qb;
      pcVar12 = "  C2MIR parser end          -- %.0f usec\n";
      auVar85._0_8_ = (double)(long)local_100._0_8_;
      auVar85._8_8_ = in_XMM2_Qb;
      auVar74 = vfmadd132sd_fma(auVar85,auVar77,ZEXT816(0x412e848000000000));
      fprintf(pFVar5,"  C2MIR parser end          -- %.0f usec\n",auVar74._0_8_ - local_c8);
      pcVar58 = c2m_ctx->options;
      if ((pcVar58->verbose_p != 0) &&
         ((__s = (node *)pcVar58->message_file, (c2m_ctx_t)__s != (c2m_ctx_t)0x0 &&
          (c2m_ctx->n_errors != 0)))) {
        pcVar12 = (char *)0xe;
        fwrite("parser - FAIL\n",0xe,1,(FILE *)__s);
        pcVar58 = c2m_ctx->options;
      }
    }
    if (pcVar58->syntax_only_p != 0) goto LAB_0017744c;
    pVVar40 = c2m_ctx->call_nodes;
    if ((pVVar40 == (VARR_node_t *)0x0) || (pVVar40->varr == (node_t_conflict *)0x0))
    goto LAB_0017789e;
    pcVar39 = c2m_ctx->check_ctx;
    local_94 = c2m_ctx->n_errors;
    __s = (node *)(ulong)local_94;
    pVVar40->els_num = 0;
    pVVar40 = pcVar39->possible_incomplete_decls;
    if ((pVVar40 != (VARR_node_t *)0x0) && (pVVar40->varr != (node_t_conflict *)0x0)) {
      pVVar40->els_num = 0;
      pcVar67 = c2m_ctx;
      local_90 = (c2m_ctx_t)n;
      check(c2m_ctx,n,(node_t_conflict)0x0);
      pVVar40 = pcVar39->possible_incomplete_decls;
      if (pVVar40 != (VARR_node_t *)0x0) {
        uVar62 = 0;
        do {
          if (pVVar40->els_num <= uVar62) goto LAB_001775b0;
          if (pVVar40->varr == (node_t_conflict *)0x0) goto LAB_00177846;
          pnVar53 = pVVar40->varr[uVar62];
          pcVar67 = c2m_ctx;
          iVar8 = incomplete_type_p(c2m_ctx,*(type **)((long)pnVar53->attr + 0x40));
          if (iVar8 != 0) {
            pVar91 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                  (node_t_conflict)(ulong)pnVar53->uid);
            pcVar67 = c2m_ctx;
            error(c2m_ctx,0x1c1f30,pVar91.fname,pVar91._8_8_);
            pVVar40 = pcVar39->possible_incomplete_decls;
          }
          uVar62 = uVar62 + 1;
        } while (pVVar40 != (VARR_node_t *)0x0);
      }
      c2mir_compile_cold_10();
LAB_001775b0:
      pcVar67 = local_90;
      pcVar58 = c2m_ctx->options;
      if (local_94 < c2m_ctx->n_errors) {
        if (pcVar58->debug_p != 0) {
          print_node(c2m_ctx,pcVar58->message_file,(node_t_conflict)local_90,0,0);
          pcVar58 = c2m_ctx->options;
        }
        if ((pcVar58->verbose_p != 0) && ((FILE *)pcVar58->message_file != (FILE *)0x0)) {
          fwrite("C2MIR context checker - FAIL\n",0x1d,1,(FILE *)pcVar58->message_file);
        }
      }
      else {
        if (pcVar58->debug_p != 0) {
          print_node(c2m_ctx,pcVar58->message_file,(node_t_conflict)local_90,0,1);
          pcVar58 = c2m_ctx->options;
        }
        if ((pcVar58->verbose_p != 0) &&
           (pFVar5 = (FILE *)pcVar58->message_file, pFVar5 != (FILE *)0x0)) {
          gettimeofday((timeval *)local_100,(__timezone_ptr_t)0x0);
          auVar79._0_8_ = (double)(long)local_100._8_8_;
          auVar79._8_8_ = in_XMM2_Qb;
          auVar87._0_8_ = (double)(long)local_100._0_8_;
          auVar87._8_8_ = in_XMM2_Qb;
          auVar74 = vfmadd132sd_fma(auVar87,auVar79,ZEXT816(0x412e848000000000));
          fprintf(pFVar5,"  C2MIR context checker end -- %.0f usec\n",auVar74._0_8_ - local_c8);
          pcVar58 = c2m_ctx->options;
        }
        sprintf(c2m_ctx->temp_str_buff,"M%ld",pcVar58->module_num);
        module = MIR_new_module(local_c0,c2m_ctx->temp_str_buff);
        gen_mir(c2m_ctx,(node_t_conflict)pcVar67);
        pcVar58 = c2m_ctx->options;
        iVar8 = pcVar58->asm_p;
        if (((iVar8 != 0) || (pcVar58->object_p != 0)) && (c2m_ctx->n_errors == 0)) {
          iVar9 = strcmp(local_a0,"<command-line>");
          pFVar5 = local_a8;
          if (iVar9 == 0) {
            MIR_output_module(local_c0,pcVar58->message_file,module);
          }
          else if (local_a8 != (FILE *)0x0) {
            if (iVar8 == 0) {
              pcVar61 = MIR_write_module;
            }
            else {
              pcVar61 = MIR_output_module;
            }
            (*pcVar61)(local_c0,local_a8,module);
            iVar8 = ferror(pFVar5);
            if ((iVar8 != 0) || (iVar8 = fclose(local_a8), iVar8 != 0)) {
              fprintf((FILE *)c2m_ctx->options->message_file,
                      "C2MIR error in writing mir for source file %s\n",local_a0);
              c2m_ctx->n_errors = c2m_ctx->n_errors + 1;
            }
          }
        }
        MIR_finish_module(local_c0);
        if ((c2m_ctx->options->verbose_p != 0) &&
           (pFVar5 = (FILE *)c2m_ctx->options->message_file, pFVar5 != (FILE *)0x0)) {
          gettimeofday((timeval *)local_100,(__timezone_ptr_t)0x0);
          auVar80._0_8_ = (double)(long)local_100._8_8_;
          auVar80._8_8_ = in_XMM2_Qb;
          auVar88._0_8_ = (double)(long)local_100._0_8_;
          auVar88._8_8_ = in_XMM2_Qb;
          auVar74 = vfmadd132sd_fma(auVar88,auVar80,ZEXT816(0x412e848000000000));
          fprintf(pFVar5,"  C2MIR generator end       -- %.0f usec\n",auVar74._0_8_ - local_c8);
        }
      }
      goto LAB_0017744c;
    }
  }
  c2mir_compile_cold_11();
  pcVar67 = (c2m_ctx_t)c2m_ctx->symbol_text;
  pcVar68 = c2m_ctx;
  iVar8 = extraout_EAX;
  if (pcVar67 != (c2m_ctx_t)0x0) {
    pcVar65 = (c2m_ctx_t)pcVar67->env[0].__jmpbuf[0];
    if (pcVar65 != (c2m_ctx_t)0x0) {
      free(pcVar65);
      free(pcVar67);
      c2m_ctx->symbol_text = (VARR_char *)0x0;
      pcVar68 = pcVar67;
      iVar8 = extraout_EAX_00;
      goto LAB_001778ea;
    }
LAB_0017825a:
    compile_finish_cold_1();
LAB_0017825f:
    compile_finish_cold_2();
LAB_00178264:
    compile_finish_cold_3();
LAB_00178269:
    compile_finish_cold_40();
LAB_0017826e:
    compile_finish_cold_41();
LAB_00178273:
    compile_finish_cold_42();
LAB_00178278:
    compile_finish_cold_43();
LAB_0017827d:
    compile_finish_cold_44();
LAB_00178282:
    pcVar68 = pcVar65;
    compile_finish_cold_17();
LAB_00178287:
    compile_finish_cold_16();
LAB_0017828c:
    compile_finish_cold_4();
LAB_00178291:
    compile_finish_cold_5();
LAB_00178296:
    compile_finish_cold_30();
LAB_0017829b:
    compile_finish_cold_31();
LAB_001782a0:
    compile_finish_cold_38();
LAB_001782a5:
    compile_finish_cold_39();
    goto LAB_001782aa;
  }
LAB_001778ea:
  pcVar67 = (c2m_ctx_t)c2m_ctx->temp_string;
  if (pcVar67 != (c2m_ctx_t)0x0) {
    pcVar65 = (c2m_ctx_t)pcVar67->env[0].__jmpbuf[0];
    if (pcVar65 != (c2m_ctx_t)0x0) {
      free(pcVar65);
      free(pcVar67);
      c2m_ctx->temp_string = (VARR_char *)0x0;
      pcVar68 = pcVar67;
      iVar8 = extraout_EAX_01;
      goto LAB_0017791b;
    }
    goto LAB_0017825f;
  }
LAB_0017791b:
  pcVar67 = (c2m_ctx_t)c2m_ctx->node_positions;
  if (pcVar67 != (c2m_ctx_t)0x0) {
    pcVar65 = (c2m_ctx_t)pcVar67->env[0].__jmpbuf[0];
    if (pcVar65 != (c2m_ctx_t)0x0) {
      free(pcVar65);
      free(pcVar67);
      c2m_ctx->node_positions = (VARR_pos_t *)0x0;
      pcVar68 = pcVar67;
      iVar8 = extraout_EAX_02;
      goto LAB_0017794c;
    }
    goto LAB_00178264;
  }
LAB_0017794c:
  if (c2m_ctx->parse_ctx == (parse_ctx *)0x0) goto LAB_00177e8f;
  pcVar67 = (c2m_ctx_t)c2m_ctx->recorded_tokens;
  if (pcVar67 != (c2m_ctx_t)0x0) {
    pcVar68 = (c2m_ctx_t)pcVar67->env[0].__jmpbuf[0];
    if (pcVar68 != (c2m_ctx_t)0x0) {
      free(pcVar68);
      free(pcVar67);
      c2m_ctx->recorded_tokens = (VARR_token_t *)0x0;
      pcVar68 = pcVar67;
      goto LAB_0017798b;
    }
    goto LAB_0017828c;
  }
LAB_0017798b:
  pcVar67 = (c2m_ctx_t)c2m_ctx->buffered_tokens;
  if (pcVar67 != (c2m_ctx_t)0x0) {
    pcVar68 = (c2m_ctx_t)pcVar67->env[0].__jmpbuf[0];
    if (pcVar68 != (c2m_ctx_t)0x0) {
      free(pcVar68);
      free(pcVar67);
      c2m_ctx->buffered_tokens = (VARR_token_t *)0x0;
      pcVar68 = pcVar67;
      goto LAB_001779bc;
    }
    goto LAB_00178291;
  }
LAB_001779bc:
  ppVar20 = c2m_ctx->pre_ctx;
  if (ppVar20 == (pre_ctx *)0x0) {
LAB_00177ce2:
    ppVar15 = c2m_ctx->parse_ctx;
    pHVar35 = ppVar15->tpname_tab;
    if (pHVar35 == (HTAB_tpname_t *)0x0) {
LAB_00177e0e:
      if (c2m_ctx->eof_s != (stream_t)0x0) {
        free_stream(c2m_ctx->eof_s);
      }
      pVVar16 = c2m_ctx->streams;
      if (pVVar16 != (VARR_stream_t *)0x0) {
LAB_00177e2b:
        sVar60 = pVVar16->els_num;
        pcVar68 = (c2m_ctx_t)pVVar16->varr;
        if (sVar60 != 0) {
          if (pcVar68 != (c2m_ctx_t)0x0) goto code_r0x00177e40;
          compile_finish_cold_28();
LAB_00178228:
          compile_finish_cold_12();
LAB_0017822d:
          compile_finish_cold_21();
LAB_00178232:
          compile_finish_cold_10();
LAB_00178237:
          compile_finish_cold_9();
          goto LAB_0017823c;
        }
        goto LAB_00177e62;
      }
      goto LAB_00177e83;
    }
    if (pHVar35->free_func == (_func_void_tpname_t_void_ptr *)0x0) {
LAB_00177d98:
      pHVar35 = ppVar15->tpname_tab;
      pcVar65 = (c2m_ctx_t)pHVar35->els;
      if ((pcVar65 == (c2m_ctx_t)0x0) ||
         (pcVar68 = (c2m_ctx_t)pcVar65->env[0].__jmpbuf[0], pcVar68 == (c2m_ctx_t)0x0))
      goto LAB_0017824b;
      free(pcVar68);
      free(pcVar65);
      pHVar35->els = (VARR_HTAB_EL_tpname_t *)0x0;
      pHVar35 = ppVar15->tpname_tab;
      pVVar29 = pHVar35->entries;
      if ((pVVar29 != (VARR_htab_ind_t *)0x0) &&
         (pcVar65 = (c2m_ctx_t)pVVar29->varr, pcVar65 != (c2m_ctx_t)0x0)) {
        free(pcVar65);
        free(pVVar29);
        pHVar35->entries = (VARR_htab_ind_t *)0x0;
        free(ppVar15->tpname_tab);
        ppVar15->tpname_tab = (HTAB_tpname_t *)0x0;
        goto LAB_00177e0e;
      }
      goto LAB_00178255;
    }
    __s = (node *)pHVar35->els;
    if ((c2m_ctx_t)__s == (c2m_ctx_t)0x0) goto LAB_001782c8;
    hVar10 = pHVar35->els_bound;
    if (hVar10 != 0) {
      pcVar67 = (c2m_ctx_t)pHVar35->arg;
      pcVar65 = (c2m_ctx_t)0x0;
      ptVar70 = (tpname_t *)((MIR_error_func_t)((c2m_ctx_t)__s)->env[0].__jmpbuf[0] + 8);
      do {
        if (ptVar70[-1].typedef_p != 0) {
          pcVar68 = pcVar67;
          (*pHVar35->free_func)(*ptVar70,pcVar67);
          hVar10 = pHVar35->els_bound;
        }
        pcVar65 = (c2m_ctx_t)((long)&pcVar65->ctx + 1);
        ptVar70 = (tpname_t *)&ptVar70[1].scope;
        __s = (node *)(ulong)hVar10;
      } while (pcVar65 < __s);
    }
    pHVar35->els_bound = 0;
    pHVar35->els_num = 0;
    pHVar35->els_start = 0;
    pVVar29 = pHVar35->entries;
    if (pVVar29 != (VARR_htab_ind_t *)0x0) {
      __s = (node *)pVVar29->els_num;
      if ((int)__s != 0) {
        pcVar68 = (c2m_ctx_t)pVVar29->varr;
        pcVar12 = (char *)0xff;
        memset(pcVar68,0xff,((ulong)__s & 0xffffffff) << 2);
      }
      goto LAB_00177d98;
    }
    goto LAB_001782cd;
  }
  pcVar67 = (c2m_ctx_t)ppVar20->once_include_files;
  if (pcVar67 != (c2m_ctx_t)0x0) {
    pcVar68 = (c2m_ctx_t)pcVar67->env[0].__jmpbuf[0];
    if (pcVar68 != (c2m_ctx_t)0x0) {
      free(pcVar68);
      free(pcVar67);
      ppVar20->once_include_files = (VARR_char_ptr_t *)0x0;
      pcVar68 = pcVar67;
      goto LAB_001779f7;
    }
    goto LAB_001782af;
  }
LAB_001779f7:
  pcVar67 = (c2m_ctx_t)ppVar20->temp_tokens;
  if (pcVar67 != (c2m_ctx_t)0x0) {
    pcVar68 = (c2m_ctx_t)pcVar67->env[0].__jmpbuf[0];
    if (pcVar68 != (c2m_ctx_t)0x0) {
      free(pcVar68);
      free(pcVar67);
      ppVar20->temp_tokens = (VARR_token_t *)0x0;
      pcVar68 = pcVar67;
      goto LAB_00177a24;
    }
    goto LAB_001782b4;
  }
LAB_00177a24:
  pcVar67 = (c2m_ctx_t)ppVar20->output_buffer;
  pcVar65 = pcVar68;
  if (pcVar67 != (c2m_ctx_t)0x0) {
    pcVar68 = (c2m_ctx_t)pcVar67->env[0].__jmpbuf[0];
    if (pcVar68 != (c2m_ctx_t)0x0) {
      free(pcVar68);
      free(pcVar67);
      ppVar20->output_buffer = (VARR_token_t *)0x0;
      pcVar65 = pcVar67;
      goto LAB_00177a57;
    }
    goto LAB_001782b9;
  }
LAB_00177a57:
  ppVar4 = c2m_ctx->pre_ctx;
  pcVar67 = (c2m_ctx_t)ppVar4->macros;
  if (pcVar67 != (c2m_ctx_t)0x0) {
    do {
      pMVar7 = pcVar67->ctx;
      pcVar48 = (c2m_ctx_t)pcVar67->env[0].__jmpbuf[0];
      pcVar65 = pcVar67;
      if (pMVar7 == (MIR_context_t)0x0) goto LAB_00177af0;
      pcVar68 = pcVar48;
      if (pcVar48 == (c2m_ctx_t)0x0) goto LAB_00178228;
      __s = (node *)((long)&pMVar7[-1].wrapper_end_addr + 7);
      pcVar67->ctx = (MIR_context_t)__s;
      pcVar48 = (c2m_ctx_t)pcVar48->env[0].__jmpbuf[(long)((long)&pMVar7[-1].wrapper_end_addr + 5)];
      pcVar58 = pcVar48->options;
      if (pcVar58 != (c2mir_options *)0x0) {
        pcVar68 = *(c2m_ctx_t *)&pcVar58->ignore_warnings_p;
        if (pcVar68 == (c2m_ctx_t)0x0) goto LAB_00178237;
        free(pcVar68);
        free(pcVar58);
        pcVar48->options = (c2mir_options *)0x0;
      }
      __ptr = (void *)pcVar48->env[0].__jmpbuf[0];
      if (__ptr != (void *)0x0) {
        pcVar68 = *(c2m_ctx_t *)((long)__ptr + 0x10);
        if (pcVar68 == (c2m_ctx_t)0x0) goto LAB_00178232;
        free(pcVar68);
        free(__ptr);
      }
      free(pcVar48);
      pcVar67 = (c2m_ctx_t)ppVar4->macros;
    } while (pcVar67 != (c2m_ctx_t)0x0);
    compile_finish_cold_11();
    pcVar65 = pcVar67;
LAB_00177af0:
    pcVar68 = pcVar48;
    if (pcVar48 != (c2m_ctx_t)0x0) {
      free(pcVar48);
      free(pcVar65);
      ppVar4->macros = (VARR_macro_t *)0x0;
      goto LAB_00177b0e;
    }
    goto LAB_001782d7;
  }
LAB_00177b0e:
  pHVar26 = ppVar4->macro_tab;
  if (pHVar26 == (HTAB_macro_t *)0x0) {
LAB_00177c1d:
    pVVar31 = ppVar20->ifs;
    if (pVVar31 != (VARR_ifstate_t *)0x0) {
      do {
        if (pVVar31->els_num == 0) goto LAB_00177c4c;
        pop_ifstate((c2m_ctx_t)c2m_ctx->pre_ctx->ifs);
        pVVar31 = ppVar20->ifs;
      } while (pVVar31 != (VARR_ifstate_t *)0x0);
      compile_finish_cold_18();
LAB_00177c4c:
      pcVar68 = (c2m_ctx_t)pVVar31->varr;
      if (pcVar68 != (c2m_ctx_t)0x0) {
        free(pcVar68);
        free(pVVar31);
        ppVar20->ifs = (VARR_ifstate_t *)0x0;
        goto LAB_00177c6f;
      }
      goto LAB_001782d2;
    }
LAB_00177c6f:
    pVVar33 = ppVar20->macro_call_stack;
    if (pVVar33 == (VARR_macro_call_t *)0x0) {
LAB_00177cd6:
      pcVar68 = (c2m_ctx_t)c2m_ctx->pre_ctx;
      free(pcVar68);
      goto LAB_00177ce2;
    }
    do {
      sVar60 = pVVar33->els_num;
      pcVar68 = (c2m_ctx_t)pVVar33->varr;
      if (sVar60 == 0) goto LAB_00177cb4;
      if (pcVar68 == (c2m_ctx_t)0x0) goto LAB_0017822d;
      __s = (node *)(sVar60 - 1);
      pVVar33->els_num = (size_t)__s;
      pcVar68 = (c2m_ctx_t)pcVar68->env[0].__jmpbuf[sVar60 - 3];
      free_macro_call((macro_call_t)pcVar68);
      pVVar33 = ppVar20->macro_call_stack;
    } while (pVVar33 != (VARR_macro_call_t *)0x0);
    compile_finish_cold_20();
LAB_00177cb4:
    if (pcVar68 != (c2m_ctx_t)0x0) {
      free(pcVar68);
      free(pVVar33);
      ppVar20->macro_call_stack = (VARR_macro_call_t *)0x0;
      goto LAB_00177cd6;
    }
    goto LAB_001782dc;
  }
  if (pHVar26->free_func == (_func_void_macro_t_void_ptr *)0x0) {
LAB_00177bab:
    pHVar26 = ppVar4->macro_tab;
    pcVar68 = (c2m_ctx_t)pHVar26->els;
    if ((pcVar68 == (c2m_ctx_t)0x0) ||
       (pcVar65 = (c2m_ctx_t)pcVar68->env[0].__jmpbuf[0], pcVar65 == (c2m_ctx_t)0x0))
    goto LAB_00178282;
    free(pcVar65);
    free(pcVar68);
    pHVar26->els = (VARR_HTAB_EL_macro_t *)0x0;
    pHVar26 = ppVar4->macro_tab;
    pVVar29 = pHVar26->entries;
    if ((pVVar29 != (VARR_htab_ind_t *)0x0) &&
       (pcVar68 = (c2m_ctx_t)pVVar29->varr, pcVar68 != (c2m_ctx_t)0x0)) {
      free(pcVar68);
      free(pVVar29);
      pHVar26->entries = (VARR_htab_ind_t *)0x0;
      free(ppVar4->macro_tab);
      ppVar4->macro_tab = (HTAB_macro_t *)0x0;
      goto LAB_00177c1d;
    }
    goto LAB_00178287;
  }
  __s = (node *)pHVar26->els;
  if ((c2m_ctx_t)__s != (c2m_ctx_t)0x0) {
    hVar10 = pHVar26->els_bound;
    if (hVar10 != 0) {
      pcVar67 = (c2m_ctx_t)pHVar26->arg;
      pcVar68 = (c2m_ctx_t)0x0;
      pcVar61 = (MIR_error_func_t)((c2m_ctx_t)__s)->env[0].__jmpbuf[0] + 8;
      do {
        if (*(int *)(pcVar61 + -8) != 0) {
          pcVar65 = *(c2m_ctx_t *)pcVar61;
          pcVar12 = (char *)pcVar67;
          (*pHVar26->free_func)((macro_t)pcVar65,pcVar67);
          hVar10 = pHVar26->els_bound;
        }
        pcVar68 = (c2m_ctx_t)((long)&pcVar68->ctx + 1);
        pcVar61 = pcVar61 + 0x10;
        __s = (node *)(ulong)hVar10;
      } while (pcVar68 < __s);
    }
    pHVar26->els_bound = 0;
    pHVar26->els_num = 0;
    pHVar26->els_start = 0;
    pVVar29 = pHVar26->entries;
    if (pVVar29 == (VARR_htab_ind_t *)0x0) goto LAB_001782e6;
    __s = (node *)pVVar29->els_num;
    if ((int)__s != 0) {
      pcVar65 = (c2m_ctx_t)pVVar29->varr;
      pcVar12 = (char *)0xff;
      memset(pcVar65,0xff,((ulong)__s & 0xffffffff) << 2);
    }
    goto LAB_00177bab;
  }
  goto LAB_001782e1;
LAB_0017781e:
  c2mir_compile_cold_25();
LAB_00177823:
  c2mir_compile_cold_23();
LAB_00177828:
  c2mir_compile_cold_21();
LAB_0017782d:
  c2mir_compile_cold_7();
LAB_00177832:
  c2mir_compile_cold_2();
LAB_00177837:
  c2mir_compile_cold_1();
LAB_0017783c:
  c2mir_compile_cold_6();
LAB_00177841:
  c2mir_compile_cold_3();
LAB_00177846:
  c2mir_compile_cold_9();
  goto LAB_0017784b;
LAB_0017780f:
  c2mir_compile_cold_5();
  goto LAB_00177814;
code_r0x00177e40:
  __s = (node *)(sVar60 - 1);
  pVVar16->els_num = (size_t)__s;
  pcVar68 = (c2m_ctx_t)pcVar68->env[0].__jmpbuf[sVar60 - 3];
  free_stream((stream_t)pcVar68);
  pVVar16 = c2m_ctx->streams;
  if (pVVar16 == (VARR_stream_t *)0x0) goto code_r0x00177e5d;
  goto LAB_00177e2b;
code_r0x00177e5d:
  compile_finish_cold_27();
LAB_00177e62:
  if (pcVar68 == (c2m_ctx_t)0x0) {
LAB_001782aa:
    compile_finish_cold_29();
LAB_001782af:
    compile_finish_cold_6();
LAB_001782b4:
    compile_finish_cold_7();
LAB_001782b9:
    compile_finish_cold_8();
LAB_001782be:
    compile_finish_cold_33();
  }
  else {
    free(pcVar68);
    free(pVVar16);
    c2m_ctx->streams = (VARR_stream_t *)0x0;
LAB_00177e83:
    pcVar68 = (c2m_ctx_t)c2m_ctx->parse_ctx;
    free(pcVar68);
    iVar8 = extraout_EAX_03;
LAB_00177e8f:
    pcVar39 = c2m_ctx->check_ctx;
    if (pcVar39 == (check_ctx *)0x0) {
LAB_0017811f:
      pVVar22 = c2m_ctx->headers;
      if (pVVar22 != (VARR_char_ptr_t *)0x0) {
        pcVar65 = (c2m_ctx_t)pVVar22->varr;
        if (pcVar65 != (c2m_ctx_t)0x0) {
          free(pcVar65);
          free(pVVar22);
          c2m_ctx->headers = (VARR_char_ptr_t *)0x0;
          iVar8 = extraout_EAX_05;
          goto LAB_00178150;
        }
        goto LAB_00178269;
      }
LAB_00178150:
      pVVar22 = c2m_ctx->system_headers;
      if (pVVar22 != (VARR_char_ptr_t *)0x0) {
        pcVar65 = (c2m_ctx_t)pVVar22->varr;
        if (pcVar65 != (c2m_ctx_t)0x0) {
          free(pcVar65);
          free(pVVar22);
          c2m_ctx->system_headers = (VARR_char_ptr_t *)0x0;
          iVar8 = extraout_EAX_06;
          goto LAB_00178181;
        }
        goto LAB_0017826e;
      }
LAB_00178181:
      pVVar40 = c2m_ctx->call_nodes;
      if (pVVar40 != (VARR_node_t *)0x0) {
        pcVar65 = (c2m_ctx_t)pVVar40->varr;
        if (pcVar65 != (c2m_ctx_t)0x0) {
          free(pcVar65);
          free(pVVar40);
          c2m_ctx->call_nodes = (VARR_node_t *)0x0;
          iVar8 = extraout_EAX_07;
          goto LAB_001781b2;
        }
        goto LAB_00178273;
      }
LAB_001781b2:
      pVVar40 = c2m_ctx->containing_anon_members;
      if (pVVar40 != (VARR_node_t *)0x0) {
        pcVar65 = (c2m_ctx_t)pVVar40->varr;
        if (pcVar65 != (c2m_ctx_t)0x0) {
          free(pcVar65);
          free(pVVar40);
          c2m_ctx->containing_anon_members = (VARR_node_t *)0x0;
          iVar8 = extraout_EAX_08;
          goto LAB_001781e3;
        }
        goto LAB_00178278;
      }
LAB_001781e3:
      pVVar54 = c2m_ctx->init_object_path;
      if (pVVar54 == (VARR_init_object_t *)0x0) {
        return iVar8;
      }
      pcVar65 = (c2m_ctx_t)pVVar54->varr;
      if (pcVar65 != (c2m_ctx_t)0x0) {
        free(pcVar65);
        free(pVVar54);
        c2m_ctx->init_object_path = (VARR_init_object_t *)0x0;
        return extraout_EAX_09;
      }
      goto LAB_0017827d;
    }
    pcVar67 = (c2m_ctx_t)pcVar39->context_stack;
    if (pcVar67 != (c2m_ctx_t)0x0) {
      pcVar68 = (c2m_ctx_t)pcVar67->env[0].__jmpbuf[0];
      if (pcVar68 != (c2m_ctx_t)0x0) {
        free(pcVar68);
        free(pcVar67);
        pcVar39->context_stack = (VARR_node_t *)0x0;
        pcVar68 = pcVar67;
        goto LAB_00177ecc;
      }
      goto LAB_00178296;
    }
LAB_00177ecc:
    pcVar67 = (c2m_ctx_t)pcVar39->label_uses;
    if (pcVar67 != (c2m_ctx_t)0x0) {
      pcVar68 = (c2m_ctx_t)pcVar67->env[0].__jmpbuf[0];
      if (pcVar68 != (c2m_ctx_t)0x0) {
        free(pcVar68);
        free(pcVar67);
        pcVar39->label_uses = (VARR_node_t *)0x0;
        pcVar68 = pcVar67;
        goto LAB_00177ef9;
      }
      goto LAB_0017829b;
    }
LAB_00177ef9:
    pHVar42 = c2m_ctx->symbol_tab;
    if (pHVar42 == (HTAB_symbol_t *)0x0) {
LAB_00178026:
      pcVar65 = (c2m_ctx_t)pcVar39->case_tab;
      if (pcVar65 != (c2m_ctx_t)0x0) {
        pcVar67 = pcVar68;
        pcVar68 = pcVar65;
        if (pcVar65->env[0].__jmpbuf[3] != 0) {
          HTAB_case_t_clear((HTAB_case_t *)pcVar65);
          pcVar68 = (c2m_ctx_t)pcVar39->case_tab;
          pcVar67 = pcVar65;
        }
        pcVar65 = (c2m_ctx_t)pcVar68->env[0].__jmpbuf[4];
        if ((pcVar65 == (c2m_ctx_t)0x0) ||
           (pcVar67 = (c2m_ctx_t)pcVar65->env[0].__jmpbuf[0], pcVar67 == (c2m_ctx_t)0x0))
        goto LAB_00178246;
        free(pcVar67);
        free(pcVar65);
        pcVar68->env[0].__jmpbuf[4] = 0;
        pHVar45 = pcVar39->case_tab;
        pVVar29 = pHVar45->entries;
        if ((pVVar29 == (VARR_htab_ind_t *)0x0) ||
           (pcVar65 = (c2m_ctx_t)pVVar29->varr, pcVar65 == (c2m_ctx_t)0x0)) goto LAB_00178250;
        free(pcVar65);
        free(pVVar29);
        pHVar45->entries = (VARR_htab_ind_t *)0x0;
        free(pcVar39->case_tab);
        pcVar39->case_tab = (HTAB_case_t *)0x0;
      }
      pVVar49 = pcVar39->func_decls_for_allocation;
      if (pVVar49 != (VARR_decl_t *)0x0) {
        pcVar68 = (c2m_ctx_t)pVVar49->varr;
        if (pcVar68 != (c2m_ctx_t)0x0) {
          free(pcVar68);
          free(pVVar49);
          pcVar39->func_decls_for_allocation = (VARR_decl_t *)0x0;
          goto LAB_001780e6;
        }
        goto LAB_001782a0;
      }
LAB_001780e6:
      pVVar40 = pcVar39->possible_incomplete_decls;
      if (pVVar40 == (VARR_node_t *)0x0) {
LAB_00178113:
        free(c2m_ctx->check_ctx);
        iVar8 = extraout_EAX_04;
        goto LAB_0017811f;
      }
      pcVar68 = (c2m_ctx_t)pVVar40->varr;
      if (pcVar68 != (c2m_ctx_t)0x0) {
        free(pcVar68);
        free(pVVar40);
        pcVar39->possible_incomplete_decls = (VARR_node_t *)0x0;
        goto LAB_00178113;
      }
      goto LAB_001782a5;
    }
    if (pHVar42->free_func == (_func_void_symbol_t_void_ptr *)0x0) {
LAB_00177fa8:
      pHVar42 = c2m_ctx->symbol_tab;
      pcVar67 = (c2m_ctx_t)pHVar42->els;
      if ((pcVar67 == (c2m_ctx_t)0x0) ||
         (pcVar68 = (c2m_ctx_t)pcVar67->env[0].__jmpbuf[0], pcVar68 == (c2m_ctx_t)0x0)) {
LAB_0017823c:
        pcVar67 = pcVar68;
        compile_finish_cold_35();
      }
      else {
        free(pcVar68);
        free(pcVar67);
        pHVar42->els = (VARR_HTAB_EL_symbol_t *)0x0;
        pHVar42 = c2m_ctx->symbol_tab;
        pVVar29 = pHVar42->entries;
        if ((pVVar29 != (VARR_htab_ind_t *)0x0) &&
           (pcVar67 = (c2m_ctx_t)pVVar29->varr, pcVar67 != (c2m_ctx_t)0x0)) {
          free(pcVar67);
          free(pVVar29);
          pHVar42->entries = (VARR_htab_ind_t *)0x0;
          pcVar68 = (c2m_ctx_t)c2m_ctx->symbol_tab;
          free(pcVar68);
          c2m_ctx->symbol_tab = (HTAB_symbol_t *)0x0;
          goto LAB_00178026;
        }
      }
      compile_finish_cold_34();
LAB_00178246:
      compile_finish_cold_37();
      pcVar68 = pcVar67;
LAB_0017824b:
      pcVar65 = pcVar68;
      compile_finish_cold_26();
LAB_00178250:
      compile_finish_cold_36();
LAB_00178255:
      compile_finish_cold_25();
      goto LAB_0017825a;
    }
    __s = (node *)pHVar42->els;
    if ((c2m_ctx_t)__s == (c2m_ctx_t)0x0) goto LAB_001782be;
    hVar10 = pHVar42->els_bound;
    if (hVar10 != 0) {
      pcVar67 = (c2m_ctx_t)pHVar42->arg;
      pcVar65 = (c2m_ctx_t)0x0;
      psVar71 = (symbol_t *)((MIR_error_func_t)((c2m_ctx_t)__s)->env[0].__jmpbuf[0] + 8);
      do {
        if (*(int *)&psVar71[-1].defs != 0) {
          pcVar68 = pcVar67;
          (*pHVar42->free_func)(*psVar71,pcVar67);
          hVar10 = pHVar42->els_bound;
        }
        pcVar65 = (c2m_ctx_t)((long)&pcVar65->ctx + 1);
        psVar71 = (symbol_t *)&psVar71[1].id;
        __s = (node *)(ulong)hVar10;
      } while (pcVar65 < __s);
    }
    pHVar42->els_bound = 0;
    pHVar42->els_num = 0;
    pHVar42->els_start = 0;
    pVVar29 = pHVar42->entries;
    if (pVVar29 != (VARR_htab_ind_t *)0x0) {
      __s = (node *)pVVar29->els_num;
      if ((int)__s != 0) {
        pcVar68 = (c2m_ctx_t)pVVar29->varr;
        pcVar12 = (char *)0xff;
        memset(pcVar68,0xff,((ulong)__s & 0xffffffff) << 2);
      }
      goto LAB_00177fa8;
    }
  }
  compile_finish_cold_32();
LAB_001782c8:
  compile_finish_cold_24();
LAB_001782cd:
  compile_finish_cold_23();
LAB_001782d2:
  compile_finish_cold_19();
LAB_001782d7:
  compile_finish_cold_13();
LAB_001782dc:
  compile_finish_cold_22();
  pcVar65 = pcVar68;
LAB_001782e1:
  compile_finish_cold_15();
LAB_001782e6:
  compile_finish_cold_14();
  if (fname == (char *)0x0) {
    __assert_fail("fname != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x3ad,"void add_stream(c2m_ctx_t, FILE *, const char *, int (*)(c2m_ctx_t))");
  }
  psVar59 = pcVar65->cs;
  if (((psVar59 != (stream_t)0x0) && (pFVar5 = (FILE *)psVar59->f, pFVar5 != (FILE *)0x0)) &&
     (pFVar5 != _stdin)) {
    fgetpos(pFVar5,(fpos_t *)&psVar59->fpos);
    fclose((FILE *)pcVar65->cs->f);
    pcVar65->cs->f = (FILE *)0x0;
  }
  psVar59 = new_stream((FILE *)pcVar12,fname,(_func_int_c2m_ctx_t *)__s);
  pcVar65->cs = psVar59;
  pVVar16 = pcVar65->streams;
  ppsVar17 = pVVar16->varr;
  if (ppsVar17 != (stream_t *)0x0) {
    sVar60 = pVVar16->els_num;
    uVar62 = sVar60 + 1;
    if (pVVar16->size < uVar62) {
      sVar60 = (uVar62 >> 1) + uVar62;
      ppsVar17 = (stream_t *)realloc(ppsVar17,sVar60 * 8);
      pVVar16->varr = ppsVar17;
      pVVar16->size = sVar60;
      sVar60 = pVVar16->els_num;
      uVar62 = sVar60 + 1;
    }
    pVVar16->els_num = uVar62;
    ppsVar17[sVar60] = psVar59;
    return (int)ppsVar17;
  }
  add_stream_cold_1();
  iVar8 = (*((c2m_ctx_t)pcVar12)->c_getc)(((c2m_ctx_t)pcVar12)->c_getc_data);
  return iVar8;
}

Assistant:

int c2mir_compile (MIR_context_t ctx, struct c2mir_options *ops, int (*getc_func) (void *),
                   void *getc_data, const char *source_name, FILE *output_file) {
  struct c2m_ctx *c2m_ctx = *c2m_ctx_loc (ctx);
  double start_time = real_usec_time ();
  node_t r;
  unsigned n_error_before;
  MIR_module_t m;

  if (c2m_ctx == NULL) return 0;
  if (setjmp (c2m_ctx->env)) {
    compile_finish (c2m_ctx);
    return 0;
  }
  compile_init (c2m_ctx, ops, getc_func, getc_data);
  if (c2m_options->verbose_p && c2m_options->message_file != NULL)
    fprintf (c2m_options->message_file, "C2MIR init end           -- %.0f usec\n",
             real_usec_time () - start_time);
  add_stream (c2m_ctx, NULL, source_name, top_level_getc);
  if (!c2m_options->no_prepro_p) add_standard_includes (c2m_ctx);
  pre (c2m_ctx);
  if (c2m_options->verbose_p && c2m_options->message_file != NULL)
    fprintf (c2m_options->message_file, "  C2MIR preprocessor end    -- %.0f usec\n",
             real_usec_time () - start_time);
  if (!c2m_options->prepro_only_p) {
    r = parse (c2m_ctx);
    if (c2m_options->verbose_p && c2m_options->message_file != NULL)
      fprintf (c2m_options->message_file, "  C2MIR parser end          -- %.0f usec\n",
               real_usec_time () - start_time);
    if (c2m_options->verbose_p && c2m_options->message_file != NULL && n_errors)
      fprintf (c2m_options->message_file, "parser - FAIL\n");
    if (!c2m_options->syntax_only_p) {
      n_error_before = n_errors;
      do_context (c2m_ctx, r);
      if (n_errors > n_error_before) {
        if (c2m_options->debug_p) print_node (c2m_ctx, c2m_options->message_file, r, 0, FALSE);
        if (c2m_options->verbose_p && c2m_options->message_file != NULL)
          fprintf (c2m_options->message_file, "C2MIR context checker - FAIL\n");
      } else {
        if (c2m_options->debug_p) print_node (c2m_ctx, c2m_options->message_file, r, 0, TRUE);
        if (c2m_options->verbose_p && c2m_options->message_file != NULL)
          fprintf (c2m_options->message_file, "  C2MIR context checker end -- %.0f usec\n",
                   real_usec_time () - start_time);
        m = MIR_new_module (ctx, get_module_name (c2m_ctx));
        gen_mir (c2m_ctx, r);
        if ((c2m_options->asm_p || c2m_options->object_p) && n_errors == 0) {
          if (strcmp (source_name, COMMAND_LINE_SOURCE_NAME) == 0) {
            MIR_output_module (ctx, c2m_options->message_file, m);
          } else if (output_file != NULL) {
            (c2m_options->asm_p ? MIR_output_module : MIR_write_module) (ctx, output_file, m);
            if (ferror (output_file) || fclose (output_file)) {
              fprintf (c2m_options->message_file, "C2MIR error in writing mir for source file %s\n",
                       source_name);
              n_errors++;
            }
          }
        }
        MIR_finish_module (ctx);
        if (c2m_options->verbose_p && c2m_options->message_file != NULL)
          fprintf (c2m_options->message_file, "  C2MIR generator end       -- %.0f usec\n",
                   real_usec_time () - start_time);
      }
    }
  }
  compile_finish (c2m_ctx);
  if (c2m_options->verbose_p && c2m_options->message_file != NULL)
    fprintf (c2m_options->message_file, "C2MIR compiler end                -- %.0f usec\n",
             real_usec_time () - start_time);
  return n_errors == 0;
}